

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_cookmem_3.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  s_useDLMalloc = 0;
  test1();
  lVar2 = std::chrono::_V2::system_clock::now();
  s_useDLMalloc = 1;
  test1();
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  std::operator<<(poVar4,",");
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar4);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    std::chrono::high_resolution_clock::time_point t1 = std::chrono::high_resolution_clock::now();

    s_useDLMalloc = true;
    test1 ();

    std::chrono::high_resolution_clock::time_point t2 = std::chrono::high_resolution_clock::now();

    s_useDLMalloc = false;
    test1 ();

    std::chrono::high_resolution_clock::time_point t3 = std::chrono::high_resolution_clock::now();

    std::cout << std::chrono::duration_cast<std::chrono::duration<double>>(t2 - t1).count() << ","
              << std::chrono::duration_cast<std::chrono::duration<double>>(t3 - t2).count() << std::endl;
    return 0;
}